

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryComparator
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,EBinaryComparatorOpCodes op)

{
  AsmJsType *this_00;
  AsmJsType *this_01;
  bool bVar1;
  RegSlot R0;
  ParseNode *pnode_00;
  ParseNode *pnode_01;
  OpCodeAsmJs *pOVar2;
  EmitExpressionInfo EVar3;
  AsmJsCompilationException *this_02;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  EmitExpressionInfo rhsEmit;
  
  pnode_00 = ParserWrapper::GetBinaryLeft(pnode);
  pnode_01 = ParserWrapper::GetBinaryRight(pnode);
  local_40 = Emit(this,pnode_00);
  this_00 = &local_40.type;
  local_38 = Emit(this,pnode_01);
  this_01 = &local_38.type;
  StartStatement(this,pnode);
  bVar1 = AsmJsType::isUnsigned(this_00);
  if (bVar1) {
    bVar1 = AsmJsType::isUnsigned(this_01);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_40);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_008646dd;
      }
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_38);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_008646dd;
      }
      R0 = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
      pOVar2 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 2);
      goto LAB_00864562;
    }
  }
  bVar1 = AsmJsType::isSigned(this_00);
  if (bVar1) {
    bVar1 = AsmJsType::isSigned(this_01);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_40);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_008646dd;
      }
      bVar1 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_38);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_008646dd;
      }
      R0 = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
      pOVar2 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8);
      goto LAB_00864562;
    }
  }
  bVar1 = AsmJsType::isDouble(this_00);
  if (bVar1) {
    bVar1 = AsmJsType::isDouble(this_01);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&local_40);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
        goto LAB_008646dd;
      }
      bVar1 = AsmJsFunc::IsValidLocation<double>(this->mFunction,&local_38);
      if (!bVar1) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
        goto LAB_008646dd;
      }
      R0 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
      AsmJsFunc::ReleaseLocation<double>(this->mFunction,&local_38);
      AsmJsFunc::ReleaseLocation<double>(this->mFunction,&local_40);
      pOVar2 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 6);
      goto LAB_00864562;
    }
  }
  bVar1 = AsmJsType::isFloat(this_00);
  if (bVar1) {
    bVar1 = AsmJsType::isFloat(this_01);
    if (bVar1) {
      bVar1 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&local_40);
      if (bVar1) {
        bVar1 = AsmJsFunc::IsValidLocation<float>(this->mFunction,&local_38);
        if (bVar1) {
          R0 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
          AsmJsFunc::ReleaseLocation<float>(this->mFunction,&local_38);
          AsmJsFunc::ReleaseLocation<float>(this->mFunction,&local_40);
          pOVar2 = (OpCodeAsmJs *)(BinaryComparatorOpCodes + (long)(int)op * 8 + 4);
LAB_00864562:
          AsmJsByteCodeWriter::AsmReg3
                    (&this->mWriter,*pOVar2,R0,local_40.super_EmitInfoBase.location,
                     local_38.super_EmitInfoBase.location);
          ByteCodeWriter::EndStatement(&(this->mWriter).super_ByteCodeWriter,pnode);
          EVar3.type.which_ = Int;
          EVar3.super_EmitInfoBase.location = R0;
          return EVar3;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
      }
      else {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
      }
      goto LAB_008646dd;
    }
  }
  this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException(this_02,L"Type not supported for comparison")
  ;
LAB_008646dd:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryComparator( ParseNode * pnode, EBinaryComparatorOpCodes op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        EmitExpressionInfo rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo(AsmJsType::Int);
        OpCodeAsmJs compOp;

        if (lType.isUnsigned() && rType.isUnsigned())
        {
            CheckNodeLocation(lhsEmit, int);
            CheckNodeLocation(rhsEmit, int);
            emitInfo.location = GetAndReleaseBinaryLocations<int>(&lhsEmit, &rhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_UInt];
        }
        else if( lType.isSigned() && rType.isSigned() )
        {
            CheckNodeLocation( lhsEmit, int );
            CheckNodeLocation( rhsEmit, int );
            emitInfo.location = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Int];
        }
        else if( lType.isDouble() && rType.isDouble() )
        {
            CheckNodeLocation( lhsEmit, double );
            CheckNodeLocation( rhsEmit, double );
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<double>( &rhsEmit );
            mFunction->ReleaseLocation<double>( &lhsEmit );
            compOp = BinaryComparatorOpCodes[op][BCOT_Double];
        }
        else if (lType.isFloat() && rType.isFloat())
        {
            CheckNodeLocation(lhsEmit, float);
            CheckNodeLocation(rhsEmit, float);
            emitInfo.location = mFunction->AcquireTmpRegister<int>();
            mFunction->ReleaseLocation<float>(&rhsEmit);
            mFunction->ReleaseLocation<float>(&lhsEmit);
            compOp = BinaryComparatorOpCodes[op][BCOT_Float];
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for comparison") );
        }
        mWriter.AsmReg3( compOp, emitInfo.location, lhsEmit.location, rhsEmit.location );
        EndStatement(pnode);
        return emitInfo;
    }